

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void RtAudio::getCompiledApi(vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> *apis)

{
  pointer pAVar1;
  allocator_type local_29;
  pointer local_28;
  pointer pAStack_20;
  pointer local_18;
  
  std::vector<RtAudio::Api,std::allocator<RtAudio::Api>>::vector<RtAudio::Api_const*,void>
            ((vector<RtAudio::Api,std::allocator<RtAudio::Api>> *)&local_28,rtaudio_compiled_apis,
             rtaudio_compiled_apis + 2,&local_29);
  pAVar1 = (apis->super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (apis->super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>)._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (apis->super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>)._M_impl.
  super__Vector_impl_data._M_finish = pAStack_20;
  (apis->super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = (pointer)0x0;
  pAStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1);
  }
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28);
  }
  return;
}

Assistant:

void RtAudio :: getCompiledApi( std::vector<RtAudio::Api> &apis )
{
  apis = std::vector<RtAudio::Api>(rtaudio_compiled_apis,
                                   rtaudio_compiled_apis + rtaudio_num_compiled_apis);
}